

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::readArrayBasedContainer<QList<TCBPoint>>(QDataStream *s,QList<TCBPoint> *c)

{
  long lVar1;
  Status SVar2;
  qint64 qVar3;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type t;
  StreamStateSaver stateSaver;
  TCBPoint *in_stack_ffffffffffffff48;
  QDataStream *in_stack_ffffffffffffff50;
  long local_90;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  qsizetype in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StreamStateSaver::StreamStateSaver
            ((StreamStateSaver *)in_stack_ffffffffffffff50,(QDataStream *)in_stack_ffffffffffffff48)
  ;
  QList<TCBPoint>::clear((QList<TCBPoint> *)in_stack_ffffffffffffff50);
  qVar3 = QDataStream::readQSizeType(in_stack_ffffffffffffff50);
  if (qVar3 < 0) {
    QDataStream::setStatus(in_RDI,SizeLimitExceeded);
  }
  else {
    QList<TCBPoint>::reserve
              ((QList<TCBPoint> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffffb8);
    for (local_90 = 0; local_90 < qVar3; local_90 = local_90 + 1) {
      TCBPoint::TCBPoint((TCBPoint *)0x71b08e);
      ::operator>>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 != Ok) {
        QList<TCBPoint>::clear((QList<TCBPoint> *)in_stack_ffffffffffffff50);
        break;
      }
      QList<TCBPoint>::append
                ((QList<TCBPoint> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)in_stack_ffffffffffffff50);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}